

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
AttributeTK<unsigned_long,_unsigned_long,_unsigned_long>::dump
          (AttributeTK<unsigned_long,_unsigned_long,_unsigned_long> *this)

{
  _Base_ptr p_Var1;
  uint64_t uVar2;
  
  dumpType(this);
  if (this->type >> 0x20 == 0) {
    dumpCKA(this->type,0x2f);
    putchar(10);
  }
  else {
    puts("overflow attribute type");
  }
  dumpKind(this);
  switch(this->kind) {
  case 1:
    puts("boolean attribute");
    dumpBoolValue(this);
    break;
  case 2:
    puts("unsigned long attribute");
    dumpULong(this->ulongValue,true);
    dumpCKx(this->type,this->ulongValue,0x2f);
    break;
  case 3:
    puts("byte string attribute");
    uVar2 = (long)(this->bytestrValue).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->bytestrValue).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    dumpULong(uVar2,true);
    printf("(length %lu)\n",uVar2);
    dumpBytes(&this->bytestrValue,true);
    return;
  default:
    puts("unknown attribute format");
    return;
  case 5:
    puts("mechanism set attribute");
    uVar2 = (this->mechSetValue)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    dumpULong(uVar2,true);
    printf("(length %lu)\n",uVar2);
    for (p_Var1 = (this->mechSetValue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(this->mechSetValue)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
      dumpULong(*(uint64_t *)(p_Var1 + 1),true);
      dumpCKM(*(unsigned_long *)(p_Var1 + 1),0x2f);
      putchar(10);
    }
    return;
  }
  putchar(10);
  return;
}

Assistant:

void dump() const {
		dumpType();
		if ((sizeof(type) > 4) &&
		    ((uint64_t)((uint32_t)type) != type))
		{
			printf("overflow attribute type\n");
		}
		else
		{
			dumpCKA((unsigned long) type, 47);
			printf("\n");
		}

		dumpKind();
		if (isBoolean())
		{
			printf("boolean attribute\n");
			dumpBoolValue();
			printf("\n");
		}
		else if (isInteger())
		{
			printf("unsigned long attribute\n");
			dumpULongValue(ulongValue);
			dumpCKx(type, ulongValue, 47);
			printf("\n");
		}
		else if (isBinary())
		{
			printf("byte string attribute\n");
			I size = bytestrValue.size();
			dumpULongValue(size);
			printf("(length %lu)\n", (unsigned long) size);
			dumpBytes(bytestrValue, true);
		}
		else if (isMechSet())
		{
			printf("mechanism set attribute\n");
			I size = mechSetValue.size();
			dumpULongValue(size);
			printf("(length %lu)\n", (unsigned long) size);
			for (typename std::set<I>::const_iterator i = mechSetValue.begin(); i != mechSetValue.end(); ++i)
			{
                                dumpULongValue(*i);
                                dumpCKM(*i, 47);
                                printf("\n");
                        }
		}
		else
		{
			printf("unknown attribute format\n");
		}
	}